

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false>::push_back
          (SmallVectorTemplateBase<llbuild::buildsystem::BuildKey,_false> *this,BuildKey *Elt)

{
  uint uVar1;
  
  uVar1 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
      super_SmallVectorBase.Capacity <= uVar1) {
    grow(this,0);
    uVar1 = (this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
            super_SmallVectorBase.Size;
  }
  std::__cxx11::string::string
            ((string *)
             ((ulong)uVar1 * 0x20 +
             (long)(this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                   super_SmallVectorBase.BeginX),(string *)Elt);
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<llbuild::buildsystem::BuildKey,_void>).
                    super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }